

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O2

void __thiscall
NewFunctionProcessingVisitor::Visit(NewFunctionProcessingVisitor *this,Formals *formals)

{
  pointer ppVar1;
  uint uVar2;
  pointer ppVar3;
  string local_b0;
  string local_90;
  string local_70 [32];
  string local_50 [32];
  
  uVar2 = FrameEmulator::GetFieldSize(&this->frame_);
  uVar2 = ~uVar2;
  ppVar1 = (formals->formals_).
           super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (formals->formals_).
                super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    std::__cxx11::string::string((string *)&local_90,(string *)&ppVar3->second);
    Symbol::Symbol((Symbol *)local_50,&local_90);
    FunctionTable::CreateVariable(&this->table_,(Symbol *)local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_b0,(string *)&ppVar3->second);
    Symbol::Symbol((Symbol *)local_70,&local_b0);
    FunctionTable::Put(&this->table_,(Symbol *)local_70,uVar2);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    uVar2 = uVar2 - 1;
  }
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(Formals* formals) {
  int index = -frame_.GetFieldSize() - 1;

  for (auto&& formal : formals->formals_) {
    table_.CreateVariable(Symbol(formal.second));
    table_.Put(Symbol(formal.second), index);
    --index;
  }
}